

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

bool __thiscall QSplitter::isCollapsible(QSplitter *this,int index)

{
  long lVar1;
  long in_FS_OFFSET;
  bool bVar2;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((index < 0) ||
     (lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8,
     *(ulong *)(lVar1 + 0x298) <= (ulong)(uint)index)) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_18 = "default";
    bVar2 = false;
    QMessageLogger::warning(local_30,"QSplitter::isCollapsible: Index %d out of range");
  }
  else {
    bVar2 = (*(byte *)(*(long *)(*(long *)(lVar1 + 0x290) + (ulong)(uint)index * 8) + 0x14) & 6) !=
            0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSplitter::isCollapsible(int index) const
{
    Q_D(const QSplitter);
    if (Q_UNLIKELY(index < 0 || index >= d->list.size())) {
        qWarning("QSplitter::isCollapsible: Index %d out of range", index);
        return false;
    }
    return d->list.at(index)->collapsible;
}